

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O0

KTXTexture2
ktx::transcode<true>(KTXTexture2 *texture,OptionsTranscodeTarget<true> *options,Reporter *report)

{
  string_view swizzle;
  string_view swizzle_00;
  string_view swizzle_01;
  string_view swizzle_02;
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  ktxTexture2 *pkVar4;
  ktx_transcode_fmt_e *pkVar5;
  ktxTexture2 **ppkVar6;
  uint *puVar7;
  uint *puVar8;
  ImageT<unsigned_char,_4U> *this;
  ktxTexture *pkVar9;
  ktx_uint8_t *pkVar10;
  ktx_uint8_t *pkVar11;
  char (*in_RCX) [37];
  long in_RDX;
  KTXTexture2 *in_RSI;
  ktxTexture2 *in_RDI;
  rgb8image dstImage_2;
  rg8image dstImage_1;
  r8image dstImage;
  rgba8image srcImage;
  ktx_uint8_t *dstImageData;
  ktx_uint8_t *srcImageData;
  ktx_size_t dstImageOffset;
  ktx_size_t srcImageOffset;
  uint32_t depthIndex;
  uint32_t layerIndex;
  uint32_t faceIndex;
  uint imageDepth;
  uint imageHeight;
  uint imageWidth;
  uint32_t levelIndex;
  KTXTexture2 *outputTexture;
  bool srgb;
  ktxTextureCreateInfo createInfo;
  KTXTexture2 convertedTexture;
  bool needSwizzle;
  bool needFormatConversion;
  ktx_error_code_e ret;
  char *in_stack_fffffffffffffd98;
  ImageT<unsigned_char,_4U> *in_stack_fffffffffffffda0;
  uint32_t h;
  Image *dst;
  uint32_t w;
  ImageT<unsigned_char,_4U> *this_00;
  uint uVar12;
  uint uVar13;
  Reporter *in_stack_fffffffffffffde0;
  KTXTexture2 *in_stack_fffffffffffffde8;
  OptionsTranscodeTarget<true> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  int iVar14;
  char (*in_stack_fffffffffffffe08) [37];
  ktxTexture2 *this_01;
  long local_e8;
  long local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8 [3];
  uint local_bc [3];
  uint local_b0 [3];
  uint local_a4;
  KTXTexture2 *local_a0;
  undefined8 local_98;
  undefined1 local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  KTXTexture2 local_40;
  byte local_32;
  byte local_31;
  undefined8 local_30;
  int local_24;
  char (*local_20) [37];
  long local_18;
  KTXTexture2 *local_10;
  
  this_01 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  OptionsTranscodeTarget<true>::validateTextureTranscode
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  pkVar4 = KTXTexture2::operator_cast_to_ktxTexture2_(local_10);
  pkVar5 = std::optional<ktx_transcode_fmt_e>::value
                     ((optional<ktx_transcode_fmt_e> *)in_stack_fffffffffffffda0);
  local_24 = ktxTexture2_TranscodeBasis(pkVar4,*pkVar5,0);
  if (local_24 != 0) {
    local_30 = ktxErrorString(local_24);
    Reporter::fatal<char_const(&)[37],char_const*>
              ((Reporter *)this_01,(ReturnCode)((ulong)in_RDI >> 0x20),local_20,
               (char **)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    in_stack_fffffffffffffe08 = local_20;
  }
  local_31 = 0;
  local_32 = 0;
  if (*(int *)(local_18 + 0x28) != 0) {
    if (*(int *)(local_18 + 0x28) == 4) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      if (bVar1) {
        local_32 = 1;
      }
    }
    else {
      local_31 = 1;
      local_32 = 1;
    }
  }
  KTXTexture2::KTXTexture2(&local_40,(nullptr_t)0x0);
  if ((local_31 & 1) != 0) {
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    pkVar4 = KTXTexture2::operator->(local_10);
    local_79 = pkVar4->vkFormat == 0x2b;
    iVar14 = *(int *)(local_18 + 0x28);
    if (iVar14 == 1) {
      uVar2 = 9;
      if ((bool)local_79) {
        uVar2 = 0xf;
      }
      local_78 = CONCAT44(uVar2,(undefined4)local_78);
    }
    else if (iVar14 == 2) {
      uVar2 = 0x10;
      if ((bool)local_79) {
        uVar2 = 0x16;
      }
      local_78 = CONCAT44(uVar2,(undefined4)local_78);
    }
    else {
      if (iVar14 != 3) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                      ,0x7d,
                      "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = true]"
                     );
      }
      uVar2 = 0x17;
      if ((bool)local_79) {
        uVar2 = 0x1d;
      }
      local_78 = CONCAT44(uVar2,(undefined4)local_78);
    }
    pkVar4 = KTXTexture2::operator->(local_10);
    local_68 = CONCAT44(local_68._4_4_,pkVar4->baseWidth);
    pkVar4 = KTXTexture2::operator->(local_10);
    local_68 = CONCAT44(pkVar4->baseHeight,(undefined4)local_68);
    pkVar4 = KTXTexture2::operator->(local_10);
    uStack_60 = CONCAT44(uStack_60._4_4_,pkVar4->baseDepth);
    pkVar4 = KTXTexture2::operator->(local_10);
    uStack_50 = CONCAT26(uStack_50._6_2_,CONCAT15(pkVar4->generateMipmaps,(undefined5)uStack_50)) &
                0xffff01ffffffffff;
    pkVar4 = KTXTexture2::operator->(local_10);
    uStack_50 = CONCAT35(uStack_50._5_3_,CONCAT14(pkVar4->isArray,(undefined4)uStack_50)) &
                0xffffff01ffffffff;
    pkVar4 = KTXTexture2::operator->(local_10);
    uStack_60 = CONCAT44(pkVar4->numDimensions,(undefined4)uStack_60);
    pkVar4 = KTXTexture2::operator->(local_10);
    uStack_50 = CONCAT44(uStack_50._4_4_,pkVar4->numFaces);
    pkVar4 = KTXTexture2::operator->(local_10);
    local_58._4_4_ = pkVar4->numLayers;
    pkVar4 = KTXTexture2::operator->(local_10);
    local_58 = CONCAT44(local_58._4_4_,pkVar4->numLevels);
    uStack_70 = 0;
    ppkVar6 = KTXTexture2::pHandle(&local_40);
    iVar3 = ktxTexture2_Create(&local_78,1,ppkVar6);
    local_24 = iVar3;
    if (iVar3 != 0) {
      local_98 = ktxErrorString(iVar3);
      Reporter::fatal<char_const(&)[36],char_const*>
                ((Reporter *)this_01,(ReturnCode)((ulong)in_RDI >> 0x20),
                 (char (*) [36])in_stack_fffffffffffffe08,(char **)CONCAT44(iVar14,iVar3));
    }
  }
  pkVar4 = KTXTexture2::handle(&local_40);
  local_a0 = local_10;
  if (pkVar4 != (ktxTexture2 *)0x0) {
    local_a0 = &local_40;
  }
  if (((local_31 & 1) != 0) || ((local_32 & 1) != 0)) {
    for (local_a4 = 0; uVar13 = local_a4, pkVar4 = KTXTexture2::operator->(local_10),
        uVar13 < pkVar4->numLevels; local_a4 = local_a4 + 1) {
      local_b0[1] = 1;
      pkVar4 = KTXTexture2::operator->(local_10);
      local_b0[0] = pkVar4->baseWidth >> ((byte)local_a4 & 0x1f);
      puVar7 = std::max<unsigned_int>(local_b0 + 1,local_b0);
      local_b0[2] = *puVar7;
      local_bc[1] = 1;
      pkVar4 = KTXTexture2::operator->(local_10);
      local_bc[0] = pkVar4->baseHeight >> ((byte)local_a4 & 0x1f);
      puVar8 = std::max<unsigned_int>(local_bc + 1,local_bc);
      local_bc[2] = *puVar8;
      local_c8[1] = 1;
      pkVar4 = KTXTexture2::operator->(local_10);
      local_c8[0] = pkVar4->baseDepth >> ((byte)local_a4 & 0x1f);
      this = (ImageT<unsigned_char,_4U> *)std::max<unsigned_int>(local_c8 + 1,local_c8);
      local_c8[2] = *(uint *)&(this->super_Image)._vptr_Image;
      local_cc = 0;
      while (uVar13 = local_cc, pkVar4 = KTXTexture2::operator->(local_10),
            uVar13 < pkVar4->numFaces) {
        local_d0 = 0;
        while (uVar12 = local_d0, pkVar4 = KTXTexture2::operator->(local_10),
              uVar12 < pkVar4->numLayers) {
          for (local_d4 = 0; local_d4 < local_c8[2]; local_d4 = local_d4 + 1) {
            pkVar4 = KTXTexture2::operator->(local_10);
            this_00 = (ImageT<unsigned_char,_4U> *)pkVar4->vtbl->GetImageOffset;
            pkVar9 = KTXTexture2::operator_cast_to_ktxTexture_(local_10);
            (*(code *)this_00)(pkVar9,local_a4,local_d0,local_cc + local_d4,&local_e0);
            pkVar4 = KTXTexture2::operator->(local_a0);
            dst = (Image *)pkVar4->vtbl->GetImageOffset;
            pkVar9 = KTXTexture2::operator_cast_to_ktxTexture_(local_a0);
            (*(code *)dst)(pkVar9,local_a4,local_d0,local_cc + local_d4,&local_e8);
            pkVar4 = KTXTexture2::operator->(local_10);
            pkVar10 = pkVar4->pData + local_e0;
            pkVar4 = KTXTexture2::operator->(local_a0);
            pkVar11 = pkVar4->pData + local_e8;
            ImageT<unsigned_char,_4U>::ImageT
                      (this_00,(uint32_t)((ulong)dst >> 0x20),(uint32_t)dst,
                       (Color *)in_stack_fffffffffffffda0);
            in_stack_fffffffffffffda0 =
                 (ImageT<unsigned_char,_4U> *)(ulong)(*(int *)(local_18 + 0x28) - 1);
            h = (uint32_t)dst;
            w = (uint32_t)((ulong)dst >> 0x20);
            switch(in_stack_fffffffffffffda0) {
            case (ImageT<unsigned_char,_4U> *)0x0:
              ImageT<unsigned_char,_1U>::ImageT
                        ((ImageT<unsigned_char,_1U> *)this_00,w,h,(Color *)in_stack_fffffffffffffda0
                        );
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_18 + 0x30));
              swizzle._M_len._4_4_ = uVar13;
              swizzle._M_len._0_4_ = uVar12;
              swizzle._M_str = (char *)this;
              ImageT<unsigned_char,_4U>::copyToR(this_00,dst,swizzle);
              ImageT<unsigned_char,_1U>::~ImageT
                        ((ImageT<unsigned_char,_1U> *)in_stack_fffffffffffffda0);
              break;
            case (ImageT<unsigned_char,_4U> *)0x1:
              ImageT<unsigned_char,_2U>::ImageT
                        ((ImageT<unsigned_char,_2U> *)this_00,w,h,(Color *)in_stack_fffffffffffffda0
                        );
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_18 + 0x30));
              swizzle_00._M_len._4_4_ = uVar13;
              swizzle_00._M_len._0_4_ = uVar12;
              swizzle_00._M_str = (char *)this;
              ImageT<unsigned_char,_4U>::copyToRG(this_00,dst,swizzle_00);
              ImageT<unsigned_char,_2U>::~ImageT
                        ((ImageT<unsigned_char,_2U> *)in_stack_fffffffffffffda0);
              break;
            case (ImageT<unsigned_char,_4U> *)0x2:
              ImageT<unsigned_char,_3U>::ImageT
                        ((ImageT<unsigned_char,_3U> *)this_00,w,h,(Color *)in_stack_fffffffffffffda0
                        );
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_18 + 0x30));
              swizzle_01._M_len._4_4_ = uVar13;
              swizzle_01._M_len._0_4_ = uVar12;
              swizzle_01._M_str = (char *)this;
              ImageT<unsigned_char,_4U>::copyToRGB(this_00,dst,swizzle_01);
              ImageT<unsigned_char,_3U>::~ImageT
                        ((ImageT<unsigned_char,_3U> *)in_stack_fffffffffffffda0);
              break;
            case (ImageT<unsigned_char,_4U> *)0x3:
              if (pkVar10 != pkVar11) {
                __assert_fail("srcImageData == dstImageData",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                              ,0xb6,
                              "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = true]"
                             );
              }
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_18 + 0x30));
              swizzle_02._M_str = (char *)puVar7;
              swizzle_02._M_len = (size_t)puVar8;
              ImageT<unsigned_char,_4U>::swizzle(this,swizzle_02);
              break;
            default:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                            ,0xbb,
                            "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = true]"
                           );
            }
            ImageT<unsigned_char,_4U>::~ImageT(in_stack_fffffffffffffda0);
          }
          local_d0 = local_d0 + 1;
        }
        local_cc = local_cc + 1;
      }
    }
  }
  KTXTexture2::KTXTexture2((KTXTexture2 *)in_RDI,local_a0);
  KTXTexture2::~KTXTexture2((KTXTexture2 *)in_stack_fffffffffffffda0);
  return (KTXTexture2)this_01;
}

Assistant:

KTXTexture2 transcode(KTXTexture2&& texture, OptionsTranscodeTarget<TRANSCODE_CMD>& options, Reporter& report) {
    options.validateTextureTranscode(texture, report);

    auto ret = ktxTexture2_TranscodeBasis(texture, options.transcodeTarget.value(), 0);
    if (ret != KTX_SUCCESS)
        report.fatal(rc::INVALID_FILE, "Failed to transcode KTX2 texture: {}", ktxErrorString(ret));

    // Need to perform format conversion and swizzling if needed
    bool needFormatConversion = false;
    bool needSwizzle = false;
    if (options.transcodeSwizzleComponents != 0) {
        if (options.transcodeSwizzleComponents == 4) {
            if (options.transcodeSwizzle != "rgba") {
                needSwizzle = true;
            }
        } else {
            needFormatConversion = true;
            needSwizzle = true;
        }
    }

    KTXTexture2 convertedTexture{nullptr};
    if (needFormatConversion) {
        ktxTextureCreateInfo createInfo;
        std::memset(&createInfo, 0, sizeof(createInfo));

        const bool srgb = (texture->vkFormat == VK_FORMAT_R8G8B8A8_SRGB);
        switch (options.transcodeSwizzleComponents) {
        case 1:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8_SRGB : VK_FORMAT_R8_UNORM;
            break;
        case 2:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8_SRGB : VK_FORMAT_R8G8_UNORM;
            break;
        case 3:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8B8_SRGB : VK_FORMAT_R8G8B8_UNORM;
            break;
        default:
            assert(false);
        }

        createInfo.baseWidth = texture->baseWidth;
        createInfo.baseHeight = texture->baseHeight;
        createInfo.baseDepth = texture->baseDepth;
        createInfo.generateMipmaps = texture->generateMipmaps;
        createInfo.isArray = texture->isArray;
        createInfo.numDimensions = texture->numDimensions;
        createInfo.numFaces = texture->numFaces;
        createInfo.numLayers = texture->numLayers;
        createInfo.numLevels = texture->numLevels;
        createInfo.pDfd = nullptr;

        ret = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE, convertedTexture.pHandle());
        if (KTX_SUCCESS != ret)
            report.fatal(rc::IO_FAILURE, "Failed to create output texture: {}", ktxErrorString(ret));
    }

    KTXTexture2& outputTexture = (convertedTexture.handle() != nullptr) ? convertedTexture : texture;
    if (needFormatConversion || needSwizzle) {
        for (uint32_t levelIndex = 0; levelIndex < texture->numLevels; ++levelIndex) {
            const auto imageWidth = std::max(1u, texture->baseWidth >> levelIndex);
            const auto imageHeight = std::max(1u, texture->baseHeight >> levelIndex);
            const auto imageDepth = std::max(1u, texture->baseDepth >> levelIndex);

            for (uint32_t faceIndex = 0; faceIndex < texture->numFaces; ++faceIndex) {
                for (uint32_t layerIndex = 0; layerIndex < texture->numLayers; ++layerIndex) {
                    for (uint32_t depthIndex = 0; depthIndex < imageDepth; ++depthIndex) {
                        ktx_size_t srcImageOffset;
                        ktxTexture_GetImageOffset(texture, levelIndex, layerIndex, faceIndex + depthIndex, &srcImageOffset);
                        ktx_size_t dstImageOffset;
                        ktxTexture_GetImageOffset(outputTexture, levelIndex, layerIndex, faceIndex + depthIndex, &dstImageOffset);

                        auto srcImageData = texture->pData + srcImageOffset;
                        auto dstImageData = outputTexture->pData + dstImageOffset;

                        rgba8image srcImage(imageWidth, imageHeight, reinterpret_cast<rgba8color*>(srcImageData));

                        switch (options.transcodeSwizzleComponents) {
                        case 1: {
                            r8image dstImage(imageWidth, imageHeight, reinterpret_cast<r8color*>(dstImageData));
                            srcImage.copyToR(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 2: {
                            rg8image dstImage(imageWidth, imageHeight, reinterpret_cast<rg8color*>(dstImageData));
                            srcImage.copyToRG(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 3: {
                            rgb8image dstImage(imageWidth, imageHeight, reinterpret_cast<rgb8color*>(dstImageData));
                            srcImage.copyToRGB(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 4: {
                            // Swizzle in-place
                            assert(srcImageData == dstImageData);
                            srcImage.swizzle(options.transcodeSwizzle);
                            break;
                        }
                        default:
                            assert(false);
                        }
                    }
                }
            }
        }
    }

    return std::move(outputTexture);
}